

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraCodeLiteGenerator::CreateNewProjectFile
          (cmExtraCodeLiteGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  _Base_ptr *filename_00;
  cmMakefile *this_00;
  cmSourceFile *this_01;
  cmExtraCodeLiteGenerator *this_02;
  bool bVar1;
  __type _Var2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  ostream *poVar6;
  string *psVar7;
  mapped_type *ppcVar8;
  iterator iVar9;
  undefined8 remote;
  undefined8 uVar10;
  _Base_ptr p_Var11;
  pointer ppcVar12;
  pointer __lhs;
  __node_base *p_Var13;
  _Alloc_hider _Var14;
  cmExtraCodeLiteGenerator *this_03;
  pointer pbVar15;
  SystemInformation info;
  string cleanCommand;
  string buildCommand;
  string projectPath;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
  cFiles;
  string projectType;
  vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> incDirsVec;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  otherFiles;
  string singleFileCommand;
  string rebuildCommand;
  string codeliteCompilerName;
  string incDirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputFiles;
  string projectName;
  string workspaceOutputDir;
  string workspaceSourcePath;
  cmGeneratedFileStream fout;
  SystemInformation local_4a0;
  cmMakefile *local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *local_470;
  string local_468;
  string local_440;
  undefined1 local_420 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  cmMakefile *local_400;
  size_t local_3f8;
  cmExtraCodeLiteGenerator *local_3f0;
  string *local_3e8;
  pointer local_3e0;
  char *local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_> local_3b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a0;
  string local_370;
  string local_350;
  string local_330;
  undefined1 *local_310;
  undefined8 local_308;
  undefined1 local_300 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f0;
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  undefined1 local_278 [584];
  
  this_00 = (*(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start)->Makefile;
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,(filename->_M_dataplus)._M_p,false);
  if (((byte)(*(_func_int **)(local_278._0_8_ + -0x18) + 0x20)[(long)local_278] & 5) == 0) {
    local_470 = lgs;
    pcVar5 = cmMakefile::GetHomeDirectory(this_00);
    std::__cxx11::string::string(local_298,pcVar5,(allocator *)local_420);
    pcVar5 = cmMakefile::GetHomeOutputDirectory(this_00);
    std::__cxx11::string::string(local_2b8,pcVar5,(allocator *)local_420);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2f0,&this_00->OutputFiles);
    std::__cxx11::string::string
              (local_2d8,(this_00->ProjectName)._M_dataplus._M_p,(allocator *)local_420);
    local_310 = local_300;
    local_308 = 0;
    local_300[0] = 0;
    local_3f0 = this;
    local_3e8 = filename;
    std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::vector
              (&local_3b8,&this_00->IncludeDirectoriesEntries);
    for (__lhs = local_3b8.super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __lhs != local_3b8.super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_420,
                     &__lhs->Value," ");
      std::__cxx11::string::append((string *)&local_310);
      std::__cxx11::string::~string((string *)local_420);
    }
    poVar6 = std::operator<<((ostream *)local_278,
                             "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n<CodeLite_Project Name=\""
                            );
    poVar6 = std::operator<<(poVar6,(this_00->ProjectName)._M_dataplus._M_p);
    std::operator<<(poVar6,"\" InternalType=\"\">\n");
    local_3d8 = local_3d0._M_local_buf + 8;
    local_3d0._M_allocated_capacity = 0;
    local_410._8_8_ = local_420 + 8;
    local_420._8_4_ = _S_red;
    local_410._M_allocated_capacity = 0;
    local_3f8 = 0;
    local_3a0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_3a0._M_impl.super__Rb_tree_header._M_header;
    local_3a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_3a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_3a0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_3d0._M_local_buf[8] = '\0';
    ppcVar12 = (local_470->
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    local_400 = (cmMakefile *)local_410._8_8_;
    local_3a0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_3a0._M_impl.super__Rb_tree_header._M_header._M_left;
    while (ppcVar12 !=
           (local_470->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
           _M_impl.super__Vector_impl_data._M_finish) {
      local_498 = (*ppcVar12)->Makefile;
      p_Var13 = &(local_498->Targets)._M_h._M_before_begin;
      local_3e0 = ppcVar12;
      while( true ) {
        p_Var13 = p_Var13->_M_nxt;
        if (p_Var13 == (__node_base *)0x0) break;
        if (*(uint *)&p_Var13[0x61]._M_nxt < 4) {
          std::__cxx11::string::assign((char *)&local_3d8);
          if (*(uint *)&p_Var13[0x61]._M_nxt < 4) {
            local_468._M_dataplus._M_p = (pointer)0x0;
            local_468._M_string_length = 0;
            local_468.field_2._M_allocated_capacity = 0;
            std::__cxx11::string::string
                      ((string *)&local_490,"CMAKE_BUILD_TYPE",(allocator *)&local_350);
            pcVar5 = cmMakefile::GetSafeDefinition(local_498,&local_490);
            std::__cxx11::string::string((string *)&local_440,pcVar5,(allocator *)&local_370);
            cmTarget::GetSourceFiles
                      ((cmTarget *)(p_Var13 + 5),
                       (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_468,
                       &local_440);
            std::__cxx11::string::~string((string *)&local_440);
            std::__cxx11::string::~string((string *)&local_490);
            for (_Var14._M_p = local_468._M_dataplus._M_p;
                _Var14._M_p != (pointer)local_468._M_string_length; _Var14._M_p = _Var14._M_p + 8) {
              cmSourceFile::GetLanguage_abi_cxx11_(&local_440,*(cmSourceFile **)_Var14._M_p);
              bVar1 = std::operator==(&local_440,"C");
              if (bVar1) {
LAB_003ffa97:
                psVar7 = cmSourceFile::GetExtension_abi_cxx11_(*(cmSourceFile **)_Var14._M_p);
                std::__cxx11::string::string((string *)&local_490,(string *)psVar7);
                pbVar15 = (this_00->SourceFileExtensions).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  if (pbVar15 ==
                      (this_00->SourceFileExtensions).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    std::__cxx11::string::~string((string *)&local_490);
                    goto LAB_003ffb01;
                  }
                  _Var2 = std::operator==(&local_490,pbVar15);
                  pbVar15 = pbVar15 + 1;
                } while (!_Var2);
                std::__cxx11::string::~string((string *)&local_490);
                this_01 = *(cmSourceFile **)_Var14._M_p;
                psVar7 = cmSourceFile::GetFullPath(this_01,(string *)0x0);
                ppcVar8 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
                                        *)local_420,psVar7);
                *ppcVar8 = this_01;
              }
              else {
                bVar1 = std::operator==(&local_440,"CXX");
                if (bVar1) goto LAB_003ffa97;
LAB_003ffb01:
                psVar7 = cmSourceFile::GetFullPath(*(cmSourceFile **)_Var14._M_p,(string *)0x0);
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_3a0,psVar7);
              }
              std::__cxx11::string::~string((string *)&local_440);
            }
            std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                      ((_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_468);
          }
        }
      }
      ppcVar12 = local_3e0 + 1;
    }
    remote = local_410._8_8_;
    while ((cmMakefile *)remote != (cmMakefile *)(local_420 + 8)) {
      filename_00 = &(((cmMakefile *)remote)->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header
                     ._M_header._M_left;
      local_498 = (cmMakefile *)remote;
      cmsys::SystemTools::GetFilenamePath(&local_440,(string *)filename_00);
      std::__cxx11::string::append((char *)&local_440);
      cmsys::SystemTools::GetFilenameWithoutExtension(&local_490,(string *)filename_00);
      std::__cxx11::string::append((string *)&local_440);
      std::__cxx11::string::~string((string *)&local_490);
      for (pbVar15 = (this_00->HeaderFileExtensions).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar15 !=
          (this_00->HeaderFileExtensions).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar15 = pbVar15 + 1) {
        std::__cxx11::string::string((string *)&local_490,(string *)&local_440);
        std::__cxx11::string::append((char *)&local_490);
        std::__cxx11::string::append((string *)&local_490);
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_3a0,&local_490);
        if ((_Rb_tree_header *)iVar9._M_node != &local_3a0._M_impl.super__Rb_tree_header) {
LAB_003ffc44:
          std::__cxx11::string::~string((string *)&local_490);
          break;
        }
        bVar1 = cmsys::SystemTools::FileExists(local_490._M_dataplus._M_p);
        if (bVar1) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_3a0,&local_490);
          goto LAB_003ffc44;
        }
        std::__cxx11::string::~string((string *)&local_490);
      }
      std::__cxx11::string::~string((string *)&local_440);
      remote = std::_Rb_tree_increment((_Rb_tree_node_base *)local_498);
    }
    cmsys::SystemTools::GetFilenamePath(&local_440,local_3e8);
    std::operator<<((ostream *)local_278,"  <VirtualDirectory Name=\"src\">\n");
    for (uVar10 = local_410._8_8_; (cmMakefile *)uVar10 != (cmMakefile *)(local_420 + 8);
        uVar10 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar10)) {
      cmSystemTools::RelativePath_abi_cxx11_
                (&local_490,(cmSystemTools *)local_440._M_dataplus._M_p,
                 (char *)(((cmMakefile *)uVar10)->CMP0054ReportedIds)._M_t._M_impl.
                         super__Rb_tree_header._M_header._M_left,(char *)remote);
      poVar6 = std::operator<<((ostream *)local_278,"    <File Name=\"");
      poVar6 = std::operator<<(poVar6,(string *)&local_490);
      std::operator<<(poVar6,"\"/>\n");
      std::__cxx11::string::~string((string *)&local_490);
    }
    std::operator<<((ostream *)local_278,"  </VirtualDirectory>\n");
    std::operator<<((ostream *)local_278,"  <VirtualDirectory Name=\"include\">\n");
    for (p_Var11 = local_3a0._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var11 != &local_3a0._M_impl.super__Rb_tree_header;
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
      cmSystemTools::RelativePath_abi_cxx11_
                (&local_490,(cmSystemTools *)local_440._M_dataplus._M_p,*(char **)(p_Var11 + 1),
                 (char *)remote);
      poVar6 = std::operator<<((ostream *)local_278,"    <File Name=\"");
      poVar6 = std::operator<<(poVar6,(string *)&local_490);
      std::operator<<(poVar6,"\"/>\n");
      std::__cxx11::string::~string((string *)&local_490);
    }
    std::operator<<((ostream *)local_278,"  </VirtualDirectory>\n");
    cmsys::SystemInformation::SystemInformation(&local_4a0);
    this_02 = local_3f0;
    cmsys::SystemInformation::RunCPUCheck(&local_4a0);
    uVar3 = cmsys::SystemInformation::GetNumberOfLogicalCPU(&local_4a0);
    uVar4 = cmsys::SystemInformation::GetNumberOfPhysicalCPU(&local_4a0);
    this_02->CpuCount = uVar4 * uVar3;
    GetCleanCommand_abi_cxx11_(&local_490,this_02,this_00);
    GetBuildCommand_abi_cxx11_(&local_468,this_02,this_00);
    this_03 = this_02;
    GetRebuildCommand_abi_cxx11_(&local_350,this_02,this_00);
    GetSingleFileBuildCommand_abi_cxx11_(&local_370,this_03,this_00);
    GetCodeLiteCompilerName_abi_cxx11_(&local_330,this_02,this_00);
    poVar6 = std::operator<<((ostream *)local_278,"\n  <Settings Type=\"");
    poVar6 = std::operator<<(poVar6,(string *)&local_3d8);
    poVar6 = std::operator<<(poVar6,"\">\n    <Configuration Name=\"");
    poVar6 = std::operator<<(poVar6,(string *)&this_02->ConfigName);
    poVar6 = std::operator<<(poVar6,"\" CompilerType=\"");
    poVar6 = std::operator<<(poVar6,(string *)&local_330);
    poVar6 = std::operator<<(poVar6,"\" DebuggerType=\"GNU gdb debugger\" Type=\"");
    poVar6 = std::operator<<(poVar6,(string *)&local_3d8);
    poVar6 = std::operator<<(poVar6,
                             "\" BuildCmpWithGlobalSettings=\"append\" BuildLnkWithGlobalSettings=\"append\" BuildResWithGlobalSettings=\"append\">\n      <Compiler Options=\"-g\" Required=\"yes\" PreCompiledHeader=\"\">\n        <IncludePath Value=\".\"/>\n      </Compiler>\n      <Linker Options=\"\" Required=\"yes\"/>\n      <ResourceCompiler Options=\"\" Required=\"no\"/>\n      <General OutputFile=\"$(IntermediateDirectory)/$(ProjectName)\" IntermediateDirectory=\"./\" Command=\"./$(ProjectName)\" CommandArguments=\"\" WorkingDirectory=\"$(IntermediateDirectory)\" PauseExecWhenProcTerminates=\"yes\"/>\n      <Debugger IsRemote=\"no\" RemoteHostName=\"\" RemoteHostPort=\"\" DebuggerPath=\"\">\n        <PostConnectCommands/>\n        <StartupCommands/>\n      </Debugger>\n      <PreBuild/>\n      <PostBuild/>\n      <CustomBuild Enabled=\"yes\">\n        <RebuildCommand>"
                            );
    poVar6 = std::operator<<(poVar6,(string *)&local_350);
    poVar6 = std::operator<<(poVar6,"</RebuildCommand>\n        <CleanCommand>");
    poVar6 = std::operator<<(poVar6,(string *)&local_490);
    poVar6 = std::operator<<(poVar6,"</CleanCommand>\n        <BuildCommand>");
    poVar6 = std::operator<<(poVar6,(string *)&local_468);
    poVar6 = std::operator<<(poVar6,"</BuildCommand>\n        <SingleFileCommand>");
    poVar6 = std::operator<<(poVar6,(string *)&local_370);
    std::operator<<(poVar6,
                    "</SingleFileCommand>\n        <PreprocessFileCommand/>\n        <WorkingDirectory>$(WorkspacePath)</WorkingDirectory>\n      </CustomBuild>\n      <AdditionalRules>\n        <CustomPostBuild/>\n        <CustomPreBuild/>\n      </AdditionalRules>\n    </Configuration>\n    <GlobalSettings>\n      <Compiler Options=\"\">\n        <IncludePath Value=\".\"/>\n      </Compiler>\n      <Linker Options=\"\">\n        <LibraryPath Value=\".\"/>\n      </Linker>\n      <ResourceCompiler Options=\"\"/>\n    </GlobalSettings>\n  </Settings>\n</CodeLite_Project>\n"
                   );
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&local_490);
    cmsys::SystemInformation::~SystemInformation(&local_4a0);
    std::__cxx11::string::~string((string *)&local_440);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_3a0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
                 *)local_420);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::~vector(&local_3b8);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string(local_2d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2f0);
    std::__cxx11::string::~string(local_2b8);
    std::__cxx11::string::~string(local_298);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  return;
}

Assistant:

void cmExtraCodeLiteGenerator
::CreateNewProjectFile(const std::vector<cmLocalGenerator*>& lgs,
                       const std::string& filename)
{
  const cmMakefile* mf=lgs[0]->GetMakefile();
  cmGeneratedFileStream fout(filename.c_str());
  if(!fout)
    {
    return;
    }

  // figure out the compiler
  //std::string compiler = this->GetCBCompilerId(mf);
  std::string workspaceSourcePath = mf->GetHomeDirectory();
  std::string workspaceOutputDir =  mf->GetHomeOutputDirectory();
  std::vector<std::string> outputFiles = mf->GetOutputFiles();
  std::string projectName = mf->GetProjectName();
  std::string incDirs;
  std::vector<cmValueWithOrigin> incDirsVec =
    mf->GetIncludeDirectoriesEntries();
  std::vector<cmValueWithOrigin>::const_iterator iterInc = incDirsVec.begin();

  //std::cout << "GetIncludeDirectories:" << std::endl;
  for(; iterInc != incDirsVec.end(); ++iterInc )
    {
    //std::cout << (*ItStrVec) << std::endl;
    incDirs += iterInc->Value + " ";
    }

  ////////////////////////////////////
  fout << "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n"
       "<CodeLite_Project Name=\"" << mf->GetProjectName()
       << "\" InternalType=\"\">\n";

  // Collect all used source files in the project
  // Sort them into two containers, one for C/C++ implementation files
  // which may have an acompanying header, one for all other files
  std::string projectType;

  std::map<std::string, cmSourceFile*> cFiles;
  std::set<std::string> otherFiles;
  for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
       lg!=lgs.end(); lg++)
    {
    cmMakefile* makefile=(*lg)->GetMakefile();
    cmTargets& targets=makefile->GetTargets();
    for (cmTargets::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {

      switch(ti->second.GetType())
        {
        case cmTarget::EXECUTABLE:
          {
          projectType = "Executable";
          }
        break;
        case cmTarget::STATIC_LIBRARY:
          {
          projectType = "Static Library";
          }
        break;
        case cmTarget::SHARED_LIBRARY:
          {
          projectType = "Dynamic Library";
          }
        break;
        case cmTarget::MODULE_LIBRARY:
          {
          projectType = "Dynamic Library";
          }
        break;
        default:  // intended fallthrough
          break;
        }

      switch(ti->second.GetType())
        {
        case cmTarget::EXECUTABLE:
        case cmTarget::STATIC_LIBRARY:
        case cmTarget::SHARED_LIBRARY:
        case cmTarget::MODULE_LIBRARY:
          {
          std::vector<cmSourceFile*> sources;
          ti->second.GetSourceFiles(sources,
                            makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (std::vector<cmSourceFile*>::const_iterator si=sources.begin();
               si!=sources.end(); si++)
            {
            // check whether it is a C/C++ implementation file
            bool isCFile = false;
            std::string lang = (*si)->GetLanguage();
            if (lang == "C" || lang == "CXX")
              {
              std::string srcext = (*si)->GetExtension();
              for(std::vector<std::string>::const_iterator
                  ext = mf->GetSourceExtensions().begin();
                  ext !=  mf->GetSourceExtensions().end();
                  ++ext)
                {
                if (srcext == *ext)
                  {
                  isCFile = true;
                  break;
                  }
                }
              }

            // then put it accordingly into one of the two containers
            if (isCFile)
              {
              cFiles[(*si)->GetFullPath()] = *si ;
              }
            else
              {
              otherFiles.insert((*si)->GetFullPath());
              }
            }
          }
        default:  // intended fallthrough
          break;
        }
      }
    }

  // The following loop tries to add header files matching to implementation
  // files to the project. It does that by iterating over all source files,
  // replacing the file name extension with ".h" and checks whether such a
  // file exists. If it does, it is inserted into the map of files.
  // A very similar version of that code exists also in the kdevelop
  // project generator.
  for (std::map<std::string, cmSourceFile*>::const_iterator
       sit=cFiles.begin();
       sit!=cFiles.end();
       ++sit)
    {
    std::string headerBasename=cmSystemTools::GetFilenamePath(sit->first);
    headerBasename+="/";
    headerBasename+=cmSystemTools::GetFilenameWithoutExtension(sit->first);

    // check if there's a matching header around
    for(std::vector<std::string>::const_iterator
        ext = mf->GetHeaderExtensions().begin();
        ext !=  mf->GetHeaderExtensions().end();
        ++ext)
      {
      std::string hname=headerBasename;
      hname += ".";
      hname += *ext;
      // if it's already in the set, don't check if it exists on disk
      std::set<std::string>::const_iterator headerIt=otherFiles.find(hname);
      if (headerIt != otherFiles.end())
        {
        break;
        }

      if(cmSystemTools::FileExists(hname.c_str()))
        {
        otherFiles.insert(hname);
        break;
        }
      }
    }

  // Get the project path ( we need it later to convert files to
  // their relative path)
  std::string projectPath = cmSystemTools::GetFilenamePath(filename);

  // Create 2 virtual folders: src and include
  // and place all the implementation files into the src
  // folder, the rest goes to the include folder
  fout<< "  <VirtualDirectory Name=\"src\">\n";

  // insert all source files in the codelite project
  // first the C/C++ implementation files, then all others
  for (std::map<std::string, cmSourceFile*>::const_iterator
       sit=cFiles.begin();
       sit!=cFiles.end();
       ++sit)
    {
    std::string relativePath =
      cmSystemTools::RelativePath(projectPath.c_str(), sit->first.c_str());
    fout<< "    <File Name=\"" << relativePath << "\"/>\n";
    }
  fout<< "  </VirtualDirectory>\n";
  fout<< "  <VirtualDirectory Name=\"include\">\n";
  for (std::set<std::string>::const_iterator
       sit=otherFiles.begin();
       sit!=otherFiles.end();
       ++sit)
    {
    std::string relativePath =
      cmSystemTools::RelativePath(projectPath.c_str(), sit->c_str());
    fout << "    <File Name=\"" << relativePath << "\"/>\n";
    }
  fout << "  </VirtualDirectory>\n";

  // Get the number of CPUs. We use this information for the make -jN
  // command
  cmsys::SystemInformation info;
  info.RunCPUCheck();

  this->CpuCount = info.GetNumberOfLogicalCPU() *
                   info.GetNumberOfPhysicalCPU();

  std::string cleanCommand      = GetCleanCommand(mf);
  std::string buildCommand      = GetBuildCommand(mf);
  std::string rebuildCommand    = GetRebuildCommand(mf);
  std::string singleFileCommand = GetSingleFileBuildCommand(mf);

  std::string codeliteCompilerName = this->GetCodeLiteCompilerName(mf);

  fout << "\n"
     "  <Settings Type=\"" << projectType << "\">\n"
     "    <Configuration Name=\"" << this->ConfigName << "\" CompilerType=\""
     << codeliteCompilerName << "\" DebuggerType=\"GNU gdb debugger\" "
     "Type=\""
     << projectType << "\" BuildCmpWithGlobalSettings=\"append\" "
     "BuildLnkWithGlobalSettings=\"append\" "
     "BuildResWithGlobalSettings=\"append\">\n"
     "      <Compiler Options=\"-g\" "
     "Required=\"yes\" PreCompiledHeader=\"\">\n"
     "        <IncludePath Value=\".\"/>\n"
     "      </Compiler>\n"
     "      <Linker Options=\"\" Required=\"yes\"/>\n"
     "      <ResourceCompiler Options=\"\" Required=\"no\"/>\n"
     "      <General OutputFile=\"$(IntermediateDirectory)/$(ProjectName)\" "
     "IntermediateDirectory=\"./\" Command=\"./$(ProjectName)\" "
     "CommandArguments=\"\" WorkingDirectory=\"$(IntermediateDirectory)\" "
     "PauseExecWhenProcTerminates=\"yes\"/>\n"
     "      <Debugger IsRemote=\"no\" RemoteHostName=\"\" "
     "RemoteHostPort=\"\" DebuggerPath=\"\">\n"
     "        <PostConnectCommands/>\n"
     "        <StartupCommands/>\n"
     "      </Debugger>\n"
     "      <PreBuild/>\n"
     "      <PostBuild/>\n"
     "      <CustomBuild Enabled=\"yes\">\n"
     "        <RebuildCommand>" << rebuildCommand << "</RebuildCommand>\n"
     "        <CleanCommand>" << cleanCommand << "</CleanCommand>\n"
     "        <BuildCommand>" << buildCommand << "</BuildCommand>\n"
     "        <SingleFileCommand>" << singleFileCommand
     << "</SingleFileCommand>\n"
     "        <PreprocessFileCommand/>\n"
     "        <WorkingDirectory>$(WorkspacePath)</WorkingDirectory>\n"
     "      </CustomBuild>\n"
     "      <AdditionalRules>\n"
     "        <CustomPostBuild/>\n"
     "        <CustomPreBuild/>\n"
     "      </AdditionalRules>\n"
     "    </Configuration>\n"
     "    <GlobalSettings>\n"
     "      <Compiler Options=\"\">\n"
     "        <IncludePath Value=\".\"/>\n"
     "      </Compiler>\n"
     "      <Linker Options=\"\">\n"
     "        <LibraryPath Value=\".\"/>\n"
     "      </Linker>\n"
     "      <ResourceCompiler Options=\"\"/>\n"
     "    </GlobalSettings>\n"
     "  </Settings>\n"
     "</CodeLite_Project>\n";
}